

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O3

int ws_dialer_get_proto(void *arg,void *buf,size_t *szp,nni_type t)

{
  int iVar1;
  char *str;
  
  nni_mtx_lock((nni_mtx *)((long)arg + 0x58));
  str = "";
  if (*(char **)((long)arg + 0xb8) != (char *)0x0) {
    str = *(char **)((long)arg + 0xb8);
  }
  iVar1 = nni_copyout_str(str,buf,szp,t);
  nni_mtx_unlock((nni_mtx *)((long)arg + 0x58));
  return iVar1;
}

Assistant:

static int
ws_dialer_get_proto(void *arg, void *buf, size_t *szp, nni_type t)
{
	nni_ws_dialer *d = arg;
	int            rv;
	nni_mtx_lock(&d->mtx);
	rv = nni_copyout_str(d->proto != NULL ? d->proto : "", buf, szp, t);
	nni_mtx_unlock(&d->mtx);
	return (rv);
}